

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O2

SUNErrCode SUNMatScaleAdd_Band(sunrealtype c,SUNMatrix A,SUNMatrix B)

{
  void *pvVar1;
  void *pvVar2;
  long lVar3;
  SUNMatrix A_00;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  pvVar1 = B->content;
  lVar6 = *(long *)((long)pvVar1 + 0x18);
  pvVar2 = A->content;
  lVar5 = *(long *)((long)pvVar2 + 0x18);
  if (lVar5 < lVar6) {
    lVar8 = *(long *)((long)pvVar2 + 0x20);
    lVar4 = *(long *)((long)pvVar1 + 0x20);
  }
  else {
    lVar4 = *(long *)((long)pvVar1 + 0x20);
    lVar8 = *(long *)((long)pvVar2 + 0x20);
    if (lVar4 <= lVar8) {
      lVar8 = 0;
      lVar5 = *(long *)((long)pvVar2 + 8);
      if (*(long *)((long)pvVar2 + 8) < 1) {
        lVar5 = lVar8;
      }
      for (; lVar8 != lVar5; lVar8 = lVar8 + 1) {
        lVar9 = *(long *)((long)pvVar2 + 0x28) * 8 +
                *(long *)(*(long *)((long)pvVar2 + 0x40) + lVar8 * 8);
        lVar3 = *(long *)((long)pvVar1 + 0x28);
        lVar10 = *(long *)(*(long *)((long)pvVar1 + 0x40) + lVar8 * 8);
        for (lVar7 = -lVar6; lVar7 <= lVar4; lVar7 = lVar7 + 1) {
          *(double *)(lVar9 + lVar7 * 8) =
               *(double *)(lVar9 + lVar7 * 8) * c + *(double *)(lVar3 * 8 + lVar10 + lVar7 * 8);
        }
      }
      return 0;
    }
  }
  if (lVar4 < lVar8) {
    lVar4 = lVar8;
  }
  if (lVar6 < lVar5) {
    lVar6 = lVar5;
  }
  lVar5 = *(long *)((long)pvVar2 + 8);
  lVar8 = lVar5 + -1;
  if (lVar4 + lVar6 < lVar5) {
    lVar8 = lVar4 + lVar6;
  }
  A_00 = SUNBandMatrixStorage(lVar5,lVar6,lVar4,lVar8,A->sunctx);
  pvVar1 = A->content;
  lVar5 = 0;
  lVar6 = *(long *)((long)pvVar1 + 8);
  if (*(long *)((long)pvVar1 + 8) < 1) {
    lVar6 = lVar5;
  }
  for (; lVar5 != lVar6; lVar5 = lVar5 + 1) {
    lVar8 = *(long *)((long)pvVar1 + 0x28);
    lVar4 = *(long *)(*(long *)((long)pvVar1 + 0x40) + lVar5 * 8);
    lVar3 = *(long *)((long)A_00->content + 0x28);
    lVar10 = *(long *)(*(long *)((long)A_00->content + 0x40) + lVar5 * 8);
    lVar7 = *(long *)((long)pvVar1 + 0x20);
    for (lVar9 = -*(long *)((long)pvVar1 + 0x18); lVar9 <= lVar7; lVar9 = lVar9 + 1) {
      *(double *)(lVar3 * 8 + lVar10 + lVar9 * 8) = *(double *)(lVar8 * 8 + lVar4 + lVar9 * 8) * c;
    }
  }
  pvVar2 = B->content;
  lVar5 = 0;
  lVar6 = *(long *)((long)pvVar2 + 8);
  if (*(long *)((long)pvVar2 + 8) < 1) {
    lVar6 = lVar5;
  }
  for (; lVar5 != lVar6; lVar5 = lVar5 + 1) {
    lVar8 = *(long *)((long)pvVar2 + 0x28);
    lVar4 = *(long *)(*(long *)((long)pvVar2 + 0x40) + lVar5 * 8);
    lVar7 = *(long *)((long)A_00->content + 0x28) * 8 +
            *(long *)(*(long *)((long)A_00->content + 0x40) + lVar5 * 8);
    lVar3 = *(long *)((long)pvVar2 + 0x20);
    for (lVar10 = -*(long *)((long)pvVar2 + 0x18); lVar10 <= lVar3; lVar10 = lVar10 + 1) {
      *(double *)(lVar7 + lVar10 * 8) =
           *(double *)(lVar8 * 8 + lVar4 + lVar10 * 8) + *(double *)(lVar7 + lVar10 * 8);
    }
  }
  free(*(void **)((long)pvVar1 + 0x30));
  pvVar1 = A->content;
  *(undefined8 *)((long)pvVar1 + 0x30) = 0;
  free(*(void **)((long)pvVar1 + 0x40));
  free(A->content);
  A->content = (void *)0x0;
  A->content = A_00->content;
  A_00->content = (void *)0x0;
  SUNMatDestroy_Band(A_00);
  return 0;
}

Assistant:

SUNErrCode SUNMatScaleAdd_Band(sunrealtype c, SUNMatrix A, SUNMatrix B)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j;
  sunrealtype *A_colj, *B_colj;

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);
  SUNAssert(SUNMatGetID(B) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrices(A, B), SUN_ERR_ARG_DIMSMISMATCH);

  /* Call separate routine in B has larger bandwidth(s) than A */
  if ((SM_UBAND_B(B) > SM_UBAND_B(A)) || (SM_LBAND_B(B) > SM_LBAND_B(A)))
  {
    SUNCheckCall(SMScaleAddNew_Band(c, A, B));
    return SUN_SUCCESS;
  }

  /* Otherwise, perform operation in-place */
  for (j = 0; j < SM_COLUMNS_B(A); j++)
  {
    A_colj = SM_COLUMN_B(A, j);
    B_colj = SM_COLUMN_B(B, j);
    for (i = -SM_UBAND_B(B); i <= SM_LBAND_B(B); i++)
    {
      A_colj[i] = c * A_colj[i] + B_colj[i];
    }
  }
  return SUN_SUCCESS;
}